

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O2

int hdr_base64_encode(uint8_t *input,size_t input_len,char *output,size_t output_len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  auVar7._8_4_ = (int)(input_len >> 0x20);
  auVar7._0_8_ = input_len;
  auVar7._12_4_ = 0x45300000;
  dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)input_len) - 4503599627370496.0)) / 3.0);
  uVar4 = (ulong)(dVar6 * 4.0);
  if (((long)(dVar6 * 4.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4) == output_len) {
    for (uVar4 = 0; (2 < input_len && (uVar4 < output_len)); uVar4 = uVar4 + 4) {
      hdr_base64_encode_block(input,output + uVar4);
      input = input + 3;
      input_len = input_len - 3;
    }
    iVar3 = 0;
    if (input_len == 1) {
      bVar1 = *input;
      output[uVar4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      output[uVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(bVar1 & 3) << 4];
      cVar5 = '=';
    }
    else {
      if (input_len != 2) {
        return 0;
      }
      bVar1 = *input;
      bVar2 = input[1];
      output[uVar4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      output[uVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
      cVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(bVar2 & 0xf) * 4];
    }
    output[uVar4 + 2] = cVar5;
    output[uVar4 + 3] = '=';
  }
  else {
    iVar3 = 0x16;
  }
  return iVar3;
}

Assistant:

int hdr_base64_encode(
    const uint8_t* input, size_t input_len, char* output, size_t output_len)
{
    size_t i, j, remaining;

    if (hdr_base64_encoded_len(input_len) != output_len)
    {
        return EINVAL;
    }

    for (i = 0, j = 0; input_len - i >= 3 && j < output_len; i += 3, j += 4)
    {
        hdr_base64_encode_block(&input[i], &output[j]);
    }

    remaining = input_len - i;

    hdr_base64_encode_block_pad(&input[i], &output[j], remaining);

    return 0;
}